

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosPluginManager.cpp
# Opt level: O0

OperatorCreateFun * __thiscall
adios2::plugin::PluginManager::GetOperatorCreateFun(PluginManager *this,string *name)

{
  bool bVar1;
  OperatorCreateFun *in_RDI;
  iterator pluginIt;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>_>
  *in_stack_fffffffffffffef8;
  function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  *in_stack_ffffffffffffff08;
  function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  *in_stack_ffffffffffffff10;
  string local_d0 [16];
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  undefined1 local_81 [56];
  undefined1 local_49 [33];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_true>
  local_20 [4];
  
  std::
  unique_ptr<adios2::plugin::PluginManager::Impl,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginManager::Impl,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
                *)0x9bb812);
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>_>
       ::find(in_stack_fffffffffffffef8,(key_type *)0x9bb826);
  std::
  unique_ptr<adios2::plugin::PluginManager::Impl,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginManager::Impl,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
                *)0x9bb83c);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>_>
       ::end(in_stack_fffffffffffffef8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    in_stack_ffffffffffffff10 =
         (function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
          *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_49 + 1),"Plugins",(allocator *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff08 =
         (function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
          *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),"PluginManager",(allocator *)in_stack_ffffffffffffff08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,"GetOperatorCreateFun",
               (allocator *)&stack0xffffffffffffff57);
    std::operator+((char *)in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  std::__detail::
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_false,_true>
  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_false,_true>
                *)0x9bba58);
  std::
  function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  return in_RDI;
}

Assistant:

PluginManager::OperatorCreateFun PluginManager::GetOperatorCreateFun(const std::string &name)
{
    auto pluginIt = m_Impl->m_OperatorRegistry.find(name);
    if (pluginIt == m_Impl->m_OperatorRegistry.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginManager", "GetOperatorCreateFun",
                                          "Couldn't find operator plugin named " + name);
    }

    return pluginIt->second.m_HandleCreate;
}